

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNList::gen_code(CTPNList *this,int discard,int for_condition)

{
  uint uVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  uint16_t tmp;
  int iVar4;
  undefined4 extraout_var;
  size_t in_RCX;
  ulong ofs;
  size_t __n;
  undefined4 in_register_00000014;
  void *__buf;
  undefined4 in_register_00000034;
  CTPNListEle *pCVar5;
  char buf_1 [2];
  char buf_2 [2];
  char buf [4];
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined2 local_28;
  undefined2 local_26;
  undefined4 local_24;
  
  iVar4 = (*(this->super_CTPNListBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[1]
          )(this,CONCAT44(in_register_00000034,discard),CONCAT44(in_register_00000014,for_condition)
           );
  if (CONCAT44(extraout_var,iVar4) == 0) {
    for (pCVar5 = (this->super_CTPNListBase).tail_; pCVar5 != (CTPNListEle *)0x0;
        pCVar5 = (pCVar5->super_CTPNListEleBase).prev_) {
      (**(pCVar5->super_CTPNListEleBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase)
                (pCVar5,0,0);
    }
    if ((this->super_CTPNListBase).cnt_ < 0x100) {
      CTcGenTarg::write_op(G_cg,0xc0);
      local_2c = (undefined1)(this->super_CTPNListBase).cnt_;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_2c,(void *)0x1,in_RCX);
      local_2b = (undefined1)G_cg->predef_meta_idx_[1];
      iVar4 = (int)&local_2b;
      __buf = (void *)0x1;
    }
    else {
      CTcGenTarg::write_op(G_cg,0xc1);
      local_28 = (undefined2)(this->super_CTPNListBase).cnt_;
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_28,(void *)0x2,in_RCX);
      local_26 = (undefined2)G_cg->predef_meta_idx_[1];
      iVar4 = (int)&local_26;
      __buf = (void *)0x2;
    }
    CTcDataStream::write(&G_cs->super_CTcDataStream,iVar4,__buf,in_RCX);
    pCVar3 = G_cg;
    G_cg->sp_depth_ = G_cg->sp_depth_ - (this->super_CTPNListBase).cnt_;
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(pCVar3,0x8b);
  }
  else {
    if (discard != 0) {
      return;
    }
    CTcGenTarg::write_op(G_cg,'\x06');
    ofs = (G_cs->super_CTcDataStream).ofs_;
    CTcGenTarg::add_const_list(G_cg,this,&G_cs->super_CTcDataStream,ofs);
    local_24 = 0;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_24,(void *)0x4,ofs);
  }
  pCVar3 = G_cg;
  iVar4 = G_cg->sp_depth_;
  uVar1 = iVar4 + 1;
  __n = (size_t)uVar1;
  G_cg->sp_depth_ = uVar1;
  if (pCVar3->max_sp_depth_ <= iVar4) {
    pCVar3->max_sp_depth_ = uVar1;
  }
  if ((discard == 0) && (((this->super_CTPNListBase).field_0x48 & 2) != 0)) {
    CTcGenTarg::write_op(G_cg,0xc0);
    local_2a = 1;
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_2a,(void *)0x1,__n);
    local_29 = (undefined1)G_cg->predef_meta_idx_[7];
    CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_29,(void *)0x1,__n);
    pCVar3 = G_cg;
    G_cg->sp_depth_ = G_cg->sp_depth_ + -1;
    CTcGenTarg::write_op(pCVar3,0x8b);
    pCVar3 = G_cg;
    iVar2 = G_cg->sp_depth_;
    iVar4 = iVar2 + 1;
    G_cg->sp_depth_ = iVar4;
    if (pCVar3->max_sp_depth_ <= iVar2) {
      pCVar3->max_sp_depth_ = iVar4;
    }
  }
  return;
}

Assistant:

void CTPNList::gen_code(int discard, int for_condition)
{
    /*
     *   Before we construct the list dynamically, check to see if the
     *   list is constant.  If it is, we need only built the list in the
     *   constant pool, and push its offset.  
     */
    if (is_const())
    {
        /* push the value only if we're not discarding it */
        if (!discard)
        {
            /* write the instruction */
            G_cg->write_op(OPC_PUSHLST);

            /* add the list to the constant pool */
            G_cg->add_const_list(this, G_cs, G_cs->get_ofs());

            /* 
             *   write a placeholder address, which will be corrected by
             *   the fixup that add_const_list() created 
             */
            G_cs->write4(0);

            /* note the push */
            G_cg->note_push();
        }
    }
    else
    {
        /*
         *   It's not a constant list, so we must generate code to construct
         *   a list dynamically.  Push each element of the list.  We need
         *   each value (hence discard = false), and we require the
         *   assignable value of each expression (hence for_condition =
         *   false).  Push the argument list in reverse order, since the
         *   run-time metaclass requires this ordering.  
         */
        for (CTPNListEle *ele = get_tail() ; ele != 0 ; ele = ele->get_prev())
            ele->gen_code(FALSE, FALSE);

        /* generate a NEW instruction for an object of metaclass LIST */
        if (get_count() <= 255)
        {
            /* the count will fit in one byte - use the short form */
            G_cg->write_op(OPC_NEW1);
            G_cs->write((char)get_count());
            G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        else
        {
            /* count doesn't fit in one byte - use the long form */
            G_cg->write_op(OPC_NEW2);
            G_cs->write2(get_count());
            G_cs->write2(G_cg->get_predef_meta_idx(TCT3_METAID_LIST));
        }
        
        /* new1/new2 remove arguments */
        G_cg->note_pop(get_count());

        /* if we're not discarding the value, push it */
        if (!discard)
        {
            G_cg->write_op(OPC_GETR0);
            G_cg->note_push();
        }
    }

    /*
     *   If this is a lookup table list, and we're not discarding the value,
     *   create the actual LookupTable object from the list source.  If we're
     *   discarding the value there's no need to create the object, since
     *   doing so will have no meaningful side effects.  
     */
    if (!discard && is_lookup_table_)
    {
        /* 
         *   To construct the lookup table, we simply pass the list of [key,
         *   value, key, value...] elements to the LookupTable constructor.
         *   The list is already on the stack, so simply call the constructor
         *   with one argument.  
         */
        G_cg->write_op(OPC_NEW1);
        G_cs->write(1);
        G_cs->write((char)G_cg->get_predef_meta_idx(TCT3_METAID_LOOKUP_TABLE));

        /* NEW1 removes arguments */
        G_cg->note_pop(1);

        /* push the result */
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}